

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O2

void dsfmt_fill_array_open_open(dsfmt_t *dsfmt,double *array,int size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  w128_t *pwVar10;
  w128_t *pwVar11;
  long lVar12;
  bool bVar13;
  w128_t local_48;
  w128_t *local_38;
  
  if ((size & 1U) != 0) {
    __assert_fail("size % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x231,"void dsfmt_fill_array_open_open(dsfmt_t *, double *, int)");
  }
  if (0x17d < size) {
    local_38 = dsfmt->status + 0xbf;
    local_48.u[0] = dsfmt->status[0xbf].u[0];
    local_48.u[1] = *(uint64_t *)((long)dsfmt->status + 0xbf8);
    do_recursion((w128_t *)array,dsfmt->status,dsfmt->status + 0x75,&local_48);
    pwVar11 = dsfmt->status + 0x76;
    for (lVar12 = 0; lVar12 != 0x490; lVar12 = lVar12 + 0x10) {
      do_recursion((w128_t *)((long)array + lVar12 + 0x10),pwVar11 + -0x75,pwVar11,&local_48);
      pwVar11 = pwVar11 + 1;
    }
    pwVar11 = dsfmt->status + 0x4a;
    lVar12 = 0x75;
    pwVar10 = (w128_t *)array;
    while (bVar13 = lVar12 != 0, lVar12 = lVar12 + -1, bVar13) {
      do_recursion(pwVar10 + 0x4a,pwVar11,pwVar10,&local_48);
      pwVar11 = pwVar11 + 1;
      pwVar10 = pwVar10 + 1;
    }
    uVar5 = (uint)size >> 1;
    pwVar11 = (w128_t *)(array + 0x17e);
    for (uVar8 = 0xbf; (long)uVar8 < (long)(int)(uVar5 - 0xbf); uVar8 = uVar8 + 1) {
      do_recursion(pwVar11,pwVar11 + -0xbf,pwVar11 + -0x4a,&local_48);
      convert_o0o1(pwVar11 + -0xbf);
      pwVar11 = pwVar11 + 1;
    }
    uVar7 = 0;
    uVar6 = (ulong)(0x17e - uVar5);
    if ((int)(0x17e - uVar5) < 1) {
      uVar6 = uVar7;
    }
    lVar12 = (ulong)uVar5 * 0x10;
    for (; uVar6 * 0x10 != uVar7; uVar7 = uVar7 + 0x10) {
      puVar1 = (undefined8 *)((long)array + uVar7 + lVar12 + -0xbf0);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)dsfmt->status + uVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
    }
    pwVar10 = dsfmt->status + uVar6;
    for (; uVar8 < uVar5; uVar8 = uVar8 + 1) {
      do_recursion(pwVar11,pwVar11 + -0xbf,pwVar11 + -0x4a,&local_48);
      uVar4 = pwVar11->u[1];
      pwVar10->u[0] = pwVar11->u[0];
      pwVar10->u[1] = uVar4;
      convert_o0o1(pwVar11 + -0xbf);
      pwVar10 = (w128_t *)(pwVar10->u + 2);
      pwVar11 = pwVar11 + 1;
    }
    for (lVar9 = -0xbf0; lVar9 != 0; lVar9 = lVar9 + 0x10) {
      convert_o0o1((w128_t *)((long)array + lVar9 + lVar12));
    }
    local_38->u[0] = local_48.u[0];
    local_38->u[1] = local_48.u[1];
    return;
  }
  __assert_fail("size >= DSFMT_N64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                ,0x232,"void dsfmt_fill_array_open_open(dsfmt_t *, double *, int)");
}

Assistant:

void dsfmt_fill_array_open_open(dsfmt_t* dsfmt, double array[], int size)
{
	assert(size % 2 == 0);
	assert(size >= DSFMT_N64);
	gen_rand_array_o0o1(dsfmt, (w128_t *)array, size / 2);
}